

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O3

Variant * Jinx::Impl::GetCallStack
                    (Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  Script *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  element_type *this_01;
  Variant *pVVar2;
  pointer pbVar3;
  long lVar4;
  CollectionPtr var;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
  functions;
  CollectionPtr local_88;
  Variant *local_78;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
  local_48;
  
  this = (Script *)(script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  Script::GetCallStack_abi_cxx11_(&local_48,this);
  local_78 = __return_storage_ptr__;
  CreateCollection();
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar4 = 1;
    pbVar3 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_01 = local_88.
                super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      pcVar1 = (pbVar3->_M_dataplus)._M_p;
      local_70 = (undefined1  [8])lVar4;
      local_68._M_p = (pointer)&local_58;
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
                          &local_68,pcVar1,pcVar1 + pbVar3->_M_string_length);
      std::
      _Rb_tree<Jinx::Variant,std::pair<Jinx::Variant_const,Jinx::Variant>,std::_Select1st<std::pair<Jinx::Variant_const,Jinx::Variant>>,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
      ::
      _M_emplace_unique<std::pair<long,std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>>
                ((_Rb_tree<Jinx::Variant,std::pair<Jinx::Variant_const,Jinx::Variant>,std::_Select1st<std::pair<Jinx::Variant_const,Jinx::Variant>>,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
                  *)this_01,
                 (pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
                  *)local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
           *)local_68._M_p != &local_58) {
        MemFree(local_68._M_p,local_58._M_allocated_capacity + 1);
      }
      pbVar3 = pbVar3 + 1;
      lVar4 = lVar4 + 1;
    } while (pbVar3 != local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pVVar2 = local_78;
  local_78->m_type = Null;
  Variant::SetCollection(local_78,&local_88);
  if (local_88.
      super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.
               super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
  ::~vector(&local_48);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return pVVar2;
}

Assistant:

inline_t Variant GetCallStack(ScriptPtr script, [[maybe_unused]] const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		auto functions = s->GetCallStack();
		auto var = CreateCollection();
		int64_t index = 1;
		for (const auto & fnName : functions)
			var->insert(std::make_pair(index++, fnName));
		return var;
	}